

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt5
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  byte bVar2;
  params *ppVar3;
  results *prVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint64 s;
  long lVar13;
  ushort uVar14;
  int iVar15;
  uint uVar16;
  ushort uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ushort uVar22;
  ushort uVar23;
  uint uVar24;
  uint64 DD [8];
  uint64 D2 [8];
  uint64 hist [8];
  uint values [8];
  uint16 solutions [529];
  
  uVar10 = (uint)(low_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar10) {
    uVar10 = 0xff;
  }
  uVar12 = (uint)(high_color->m_s[0] * 256.0);
  uVar16 = 0xff;
  if ((int)uVar12 < 0xff) {
    uVar16 = uVar12;
  }
  hist[6] = 0;
  hist[7] = 0;
  hist[4] = 0;
  hist[5] = 0;
  hist[2] = 0;
  hist[3] = 0;
  hist[0] = 0;
  hist[1] = 0;
  D2[6] = 0;
  D2[7] = 0;
  D2[4] = 0;
  D2[5] = 0;
  D2[2] = 0;
  D2[3] = 0;
  D2[0] = 0;
  D2[1] = 0;
  DD[6] = 0;
  DD[7] = 0;
  DD[4] = 0;
  DD[5] = 0;
  DD[2] = 0;
  DD[3] = 0;
  DD[0] = 0;
  DD[1] = 0;
  ppVar3 = this->m_pParams;
  uVar12 = ppVar3->m_num_pixels;
  uVar18 = ppVar3->m_alpha_comp_index;
  for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
    bVar1 = ppVar3->m_pPixels[uVar19].field_0.c[uVar18];
    bVar2 = ppVar3->m_pSelectors[uVar19];
    hist[bVar2] = hist[bVar2] + 1;
    D2[bVar2] = D2[bVar2] + (ulong)((uint)bVar1 + (uint)bVar1);
    DD[bVar2] = DD[bVar2] + (ulong)((uint)bVar1 * (uint)bVar1);
  }
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  uVar12 = 0;
  if (0 < (int)uVar16) {
    uVar12 = uVar16;
  }
  uVar16 = uVar10 & 0xff;
  uVar18 = uVar12 & 0xff;
  if (uVar16 == uVar18) {
    if ((uVar10 & 0xff) == 0) {
      solutions[0] = 1;
    }
    else {
      solutions[0] = ((short)(uVar16 << 8) + (ushort)uVar16) - 0x100;
    }
  }
  else if (uVar18 < uVar16) {
    solutions[0] = (ushort)(uVar18 << 8) | (ushort)uVar16;
  }
  else {
    solutions[0] = (ushort)(uVar16 << 8) | (ushort)uVar18;
  }
  uVar19 = 1;
  uVar5 = uVar10 + 0xf5;
  if (uVar16 < 0xc) {
    uVar5 = 0;
  }
  uVar9 = (short)uVar10 + 0xbU & 0xff;
  uVar6 = uVar12 + 0xf5 & 0xff;
  if (uVar18 < 0xc) {
    uVar6 = 0;
  }
  uVar7 = uVar12 + 0xb & 0xff;
  if (0xf3 < uVar18) {
    uVar7 = 0xff;
  }
  if (0xf3 < uVar16) {
    uVar9 = 0xff;
  }
  for (uVar24 = uVar5 & 0xff; uVar23 = (ushort)uVar24, uVar23 <= uVar9; uVar24 = uVar24 + 1) {
    uVar20 = uVar24 & 0xffff;
    uVar14 = uVar23 * 0x100 - 0x100 | uVar23;
    iVar15 = uVar6 << 8;
    uVar8 = uVar6;
    if (uVar23 == 0) {
      uVar14 = 1;
    }
    for (; uVar17 = (ushort)uVar8, uVar17 <= (ushort)uVar7; uVar8 = uVar8 + 1) {
      uVar21 = uVar19;
      if (((uVar23 <= uVar17 || (uVar17 < (ushort)(uVar5 & 0xff) || uVar7 < uVar20)) &&
          (uVar12 != uVar8 || uVar16 != uVar20)) && (uVar10 != uVar8 || uVar18 != uVar20)) {
        uVar22 = uVar14;
        if (uVar23 != uVar17) {
          if (uVar17 < uVar23) {
            uVar22 = (ushort)iVar15 | uVar23;
          }
          else {
            uVar22 = uVar17 | uVar23 * 0x100;
          }
        }
        uVar21 = (ulong)((int)uVar19 + 1);
        solutions[uVar19] = uVar22;
      }
      uVar19 = uVar21;
      iVar15 = iVar15 + 0x100;
    }
  }
  uVar21 = 0;
  do {
    if (uVar21 == uVar19) {
      return;
    }
    uVar9 = solutions[uVar21];
    dxt5_block::get_block_values8(values,(uint)(byte)uVar9,(uint)(uVar9 >> 8));
    uVar11 = 0;
    for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
      uVar11 = uVar11 + DD[lVar13] +
               (hist[lVar13] * (ulong)values[lVar13] - D2[lVar13]) * (ulong)values[lVar13];
    }
    prVar4 = this->m_pResults;
    if (uVar11 < prVar4->m_error) {
      prVar4->m_low_color = uVar9 & 0xff;
      prVar4->m_high_color = uVar9 >> 8;
      prVar4->m_error = uVar11;
      if (uVar11 == 0) {
        return;
      }
    }
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt5(vec3F low_color, vec3F high_color)
    {
        uint8 L0 = math::clamp<int>(low_color[0] * 256.0f, 0, 255);
        uint8 H0 = math::clamp<int>(high_color[0] * 256.0f, 0, 255);

        uint64 hist[8] = {}, D2[8] = {}, DD[8] = {};
        for (uint c = m_pParams->m_alpha_comp_index, i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint8 a = m_pParams->m_pPixels[i][c];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            D2[s] += a * 2;
            DD[s] += a * a;
        }

        uint16 solutions[529];
        uint solutions_count = 0;
        solutions[solutions_count++] = L0 == H0 ? H0 ? H0 - 1 << 8 | L0 : 1 : L0 > H0 ? H0 << 8 | L0
                                                                                      : L0 << 8 | H0;
        uint8 minL = L0 <= 11 ? 0 : L0 - 11, maxL = L0 >= 244 ? 255 : L0 + 11;
        uint8 minH = H0 <= 11 ? 0 : H0 - 11, maxH = H0 >= 244 ? 255 : H0 + 11;
        for (uint16 L = minL; L <= maxL; L++)
        {
            for (uint16 H = minH; H <= maxH; H++)
            {
                if ((maxH < L || L <= H || H < minL) && (L != L0 || H != H0) && (L != H0 || H != L0))
                {
                    solutions[solutions_count++] = L == H ? H ? H - 1 << 8 | L : 1 : L > H ? H << 8 | L
                                                                                           : L << 8 | H;
                }
            }
        }

        for (uint i = 0; i < solutions_count; i++)
        {
            uint8 L = solutions[i] & 0xFF;
            uint8 H = solutions[i] >> 8;
            uint values[8];
            dxt5_block::get_block_values8(values, L, H);
            uint64 error = 0;
            for (uint64 s = 0; s < 8; s++)
            {
                error += hist[s] * values[s] * values[s] - D2[s] * values[s] + DD[s];
            }
            if (error < m_pResults->m_error)
            {
                m_pResults->m_low_color = L;
                m_pResults->m_high_color = H;
                m_pResults->m_error = error;
                if (!m_pResults->m_error)
                {
                    return;
                }
            }
        }
    }